

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException(SAXParseException *this,SAXParseException *toCopy)

{
  short *psVar1;
  XMLCh *pXVar2;
  MemoryManager *pMVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  XMLCh *pXVar5;
  
  SAXException::SAXException(&this->super_SAXException,&toCopy->super_SAXException);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_00418c30;
  this->fColumnNumber = toCopy->fColumnNumber;
  this->fLineNumber = toCopy->fLineNumber;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  pXVar2 = toCopy->fPublicId;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    pMVar3 = (toCopy->super_SAXException).fMemoryManager;
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar5,pXVar2,sVar6);
  }
  this->fPublicId = pXVar5;
  pXVar2 = toCopy->fSystemId;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar5 = (XMLCh *)0x0;
  }
  else {
    pMVar3 = (toCopy->super_SAXException).fMemoryManager;
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar6);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    memcpy(pXVar5,pXVar2,sVar6);
  }
  this->fSystemId = pXVar5;
  return;
}

Assistant:

SAXParseException::SAXParseException(const SAXParseException& toCopy) :

    SAXException(toCopy)
    , fColumnNumber(toCopy.fColumnNumber)
    , fLineNumber(toCopy.fLineNumber)
    , fPublicId(0)
    , fSystemId(0)
{
    fPublicId = XMLString::replicate(toCopy.fPublicId, toCopy.fMemoryManager);
    fSystemId = XMLString::replicate(toCopy.fSystemId, toCopy.fMemoryManager);
}